

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int moveToRoot(BtCursor *pCur)

{
  char cVar1;
  u32 newPgno;
  int iVar2;
  Pgno pgno;
  MemPage *pPage;
  
  if (pCur->iPage < '\0') {
    pgno = pCur->pgnoRoot;
    if (pgno == 0) goto LAB_00144e2a;
    if (2 < pCur->eState) {
      if (pCur->eState == 4) {
        return pCur->skipNext;
      }
      sqlite3BtreeClearCursor(pCur);
      pgno = pCur->pgnoRoot;
    }
    iVar2 = getAndInitPage(pCur->pBtree->pBt,pgno,&pCur->pPage,(BtCursor *)0x0,
                           (uint)pCur->curPagerFlags);
    if (iVar2 != 0) {
      pCur->eState = '\x01';
      return iVar2;
    }
    pCur->iPage = '\0';
    pPage = pCur->pPage;
    pCur->curIntKey = pPage->intKey;
LAB_00144e9f:
    if ((pPage->isInit == '\0') || ((bool)pPage->intKey != (pCur->pKeyInfo == (KeyInfo *)0x0))) {
      iVar2 = 0x10b0f;
      goto LAB_00144ebd;
    }
  }
  else {
    pPage = pCur->pPage;
    if (pCur->iPage == '\0') goto LAB_00144e9f;
    while( true ) {
      releasePageNotNull(pPage);
      cVar1 = pCur->iPage + -1;
      pCur->iPage = cVar1;
      if (cVar1 == '\0') break;
      pPage = pCur->apPage[cVar1];
    }
    pPage = pCur->apPage[0];
    pCur->pPage = pPage;
  }
  pCur->ix = 0;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf1;
  if (pPage->nCell != 0) {
    pCur->eState = '\0';
    return 0;
  }
  if (pPage->leaf != '\0') {
LAB_00144e2a:
    pCur->eState = '\x01';
    return 0x10;
  }
  if (pPage->pgno == 1) {
    newPgno = sqlite3Get4byte(pPage->aData + (ulong)pPage->hdrOffset + 8);
    pCur->eState = '\0';
    iVar2 = moveToChild(pCur,newPgno);
    return iVar2;
  }
  iVar2 = 0x10b1c;
LAB_00144ebd:
  iVar2 = sqlite3CorruptError(iVar2);
  return iVar2;
}

Assistant:

static int moveToRoot(BtCursor *pCur){
  MemPage *pRoot;
  int rc = SQLITE_OK;

  assert( cursorOwnsBtShared(pCur) );
  assert( CURSOR_INVALID < CURSOR_REQUIRESEEK );
  assert( CURSOR_VALID   < CURSOR_REQUIRESEEK );
  assert( CURSOR_FAULT   > CURSOR_REQUIRESEEK );
  assert( pCur->eState < CURSOR_REQUIRESEEK || pCur->iPage<0 );
  assert( pCur->pgnoRoot>0 || pCur->iPage<0 );

  if( pCur->iPage>=0 ){
    if( pCur->iPage ){
      releasePageNotNull(pCur->pPage);
      while( --pCur->iPage ){
        releasePageNotNull(pCur->apPage[pCur->iPage]);
      }
      pCur->pPage = pCur->apPage[0];
      goto skip_init;
    }
  }else if( pCur->pgnoRoot==0 ){
    pCur->eState = CURSOR_INVALID;
    return SQLITE_EMPTY;
  }else{
    assert( pCur->iPage==(-1) );
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      if( pCur->eState==CURSOR_FAULT ){
        assert( pCur->skipNext!=SQLITE_OK );
        return pCur->skipNext;
      }
      sqlite3BtreeClearCursor(pCur);
    }
    rc = getAndInitPage(pCur->pBtree->pBt, pCur->pgnoRoot, &pCur->pPage,
                        0, pCur->curPagerFlags);
    if( rc!=SQLITE_OK ){
      pCur->eState = CURSOR_INVALID;
      return rc;
    }
    pCur->iPage = 0;
    pCur->curIntKey = pCur->pPage->intKey;
  }
  pRoot = pCur->pPage;
  assert( pRoot->pgno==pCur->pgnoRoot );

  /* If pCur->pKeyInfo is not NULL, then the caller that opened this cursor
  ** expected to open it on an index b-tree. Otherwise, if pKeyInfo is
  ** NULL, the caller expects a table b-tree. If this is not the case,
  ** return an SQLITE_CORRUPT error. 
  **
  ** Earlier versions of SQLite assumed that this test could not fail
  ** if the root page was already loaded when this function was called (i.e.
  ** if pCur->iPage>=0). But this is not so if the database is corrupted 
  ** in such a way that page pRoot is linked into a second b-tree table 
  ** (or the freelist).  */
  assert( pRoot->intKey==1 || pRoot->intKey==0 );
  if( pRoot->isInit==0 || (pCur->pKeyInfo==0)!=pRoot->intKey ){
    return SQLITE_CORRUPT_PAGE(pCur->pPage);
  }

skip_init:  
  pCur->ix = 0;
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidNKey|BTCF_ValidOvfl);

  pRoot = pCur->pPage;
  if( pRoot->nCell>0 ){
    pCur->eState = CURSOR_VALID;
  }else if( !pRoot->leaf ){
    Pgno subpage;
    if( pRoot->pgno!=1 ) return SQLITE_CORRUPT_BKPT;
    subpage = get4byte(&pRoot->aData[pRoot->hdrOffset+8]);
    pCur->eState = CURSOR_VALID;
    rc = moveToChild(pCur, subpage);
  }else{
    pCur->eState = CURSOR_INVALID;
    rc = SQLITE_EMPTY;
  }
  return rc;
}